

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memarena.cpp
# Opt level: O2

void * __thiscall FMemArena::Alloc(FMemArena *this,size_t size)

{
  void *pvVar1;
  Block *pBVar2;
  void *pvVar3;
  
  pBVar2 = (Block *)this;
  do {
    pBVar2 = pBVar2->NextBlock;
    if (pBVar2 == (Block *)0x0) {
      pBVar2 = AddBlock(this,size);
      pvVar1 = pBVar2->Avail;
      pvVar3 = (void *)(size + (long)pvVar1);
      if (pBVar2->Limit < pvVar3) {
        return (void *)0x0;
      }
      pBVar2->Avail = (void *)((long)pvVar3 + 7U & 0xfffffffffffffff8);
      return pvVar1;
    }
    pvVar1 = pBVar2->Avail;
    if (pBVar2->Limit < (void *)((long)pvVar1 + size)) {
      pvVar1 = (void *)0x0;
    }
    else {
      pBVar2->Avail = (void *)((long)((long)pvVar1 + size) + 7U & 0xfffffffffffffff8);
    }
  } while (pvVar1 == (void *)0x0);
  return pvVar1;
}

Assistant:

void *FMemArena::Alloc(size_t size)
{
	Block *block;

	for (block = TopBlock; block != NULL; block = block->NextBlock)
	{
		void *res = block->Alloc(size);
		if (res != NULL)
		{
			return res;
		}
	}
	block = AddBlock(size);
	return block->Alloc(size);
}